

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache-aliasing.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *this;
  ulong __n;
  int *__p;
  pointer local_c0;
  ulong local_b8;
  size_t i;
  vector<int_*,_std::allocator<int_*>_> data;
  size_t startAddress;
  unique_ptr<int[],_std::default_delete<int[]>_> memory;
  string local_80 [32];
  long local_60;
  size_t increment;
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  size_t count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  count = (size_t)argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    this = std::operator<<((ostream *)&std::cout,"Usage: cache-aliasing <count> <increment>");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    iVar3 = std::__cxx11::stoi((string *)local_40,(size_t *)0x0,10);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar1 = *(char **)(count + 0x10);
    local_20 = (long)iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,pcVar1,
               (allocator *)
               ((long)&memory._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl + 7));
    iVar3 = std::__cxx11::stoi((string *)local_80,(size_t *)0x0,10);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&memory._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl + 7));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_20 * (long)iVar3;
    __n = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    local_60 = (long)iVar3;
    __p = (int *)operator_new__(__n);
    memset(__p,0,__n);
    std::unique_ptr<int[],std::default_delete<int[]>>::
    unique_ptr<int*,std::default_delete<int[]>,void,bool>
              ((unique_ptr<int[],std::default_delete<int[]>> *)&startAddress,__p);
    data.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                            ((unique_ptr<int[],_std::default_delete<int[]>_> *)&startAddress);
    std::vector<int_*,_std::allocator<int_*>_>::vector((vector<int_*,_std::allocator<int_*>_> *)&i);
    for (local_b8 = 0; local_b8 < local_20; local_b8 = local_b8 + 1) {
      local_c0 = (pointer)((long)data.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + local_b8 * local_60);
      std::vector<int_*,_std::allocator<int_*>_>::push_back
                ((vector<int_*,_std::allocator<int_*>_> *)&i,(value_type *)&local_c0);
    }
    test_memory((vector<int_*,_std::allocator<int_*>_> *)&i);
    argv_local._4_4_ = 0;
    std::vector<int_*,_std::allocator<int_*>_>::~vector((vector<int_*,_std::allocator<int_*>_> *)&i)
    ;
    std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)&startAddress);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: cache-aliasing <count> <increment>" << std::endl;
        return 1;
    }

    size_t count = static_cast<size_t>(std::stoi(argv[1]));
    size_t increment = static_cast<size_t>(std::stoi(argv[2]));

    auto memory = std::unique_ptr<int[]>(new int[count * increment]());
    auto startAddress = reinterpret_cast<size_t>(memory.get());

    std::vector<int*> data;

    for (size_t i = 0; i < count; i++)
    {
        data.push_back((int*)(startAddress + i * increment));
    }

    test_memory(data);

    return 0;
}